

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM_derive.cpp
# Opt level: O3

void pelelm_dermixfrac(Box *bx,FArrayBox *derfab,int dcomp,int ncomp,FArrayBox *datfab,
                      Geometry *param_6,Real param_7,int *param_8,int param_9)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  double *pdVar12;
  double *pdVar13;
  Real RVar14;
  long lVar15;
  long lVar16;
  double *pdVar17;
  long lVar18;
  Array<Real,_9> *pAVar19;
  long lVar20;
  long lVar21;
  double *pdVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  int iVar27;
  long lVar28;
  int iVar29;
  double *pdVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  bool bVar34;
  byte bVar35;
  double dVar36;
  double dVar37;
  double local_88 [11];
  
  bVar35 = 0;
  if (!PeleLM::mixture_fraction_ready) {
    amrex::Abort_host("Mixture fraction not initialized");
  }
  RVar14 = PeleLM::Zox;
  pdVar12 = (datfab->super_BaseFab<double>).dptr;
  iVar2 = (datfab->super_BaseFab<double>).domain.smallend.vect[0];
  lVar26 = (long)iVar2;
  iVar3 = (datfab->super_BaseFab<double>).domain.smallend.vect[1];
  iVar4 = (datfab->super_BaseFab<double>).domain.smallend.vect[2];
  iVar29 = (datfab->super_BaseFab<double>).domain.bigend.vect[0];
  iVar5 = (datfab->super_BaseFab<double>).domain.bigend.vect[1];
  iVar27 = (datfab->super_BaseFab<double>).domain.bigend.vect[2];
  pdVar13 = (derfab->super_BaseFab<double>).dptr;
  lVar33 = (long)(derfab->super_BaseFab<double>).domain.smallend.vect[0];
  lVar15 = (long)(derfab->super_BaseFab<double>).domain.smallend.vect[1];
  iVar6 = (derfab->super_BaseFab<double>).domain.smallend.vect[2];
  iVar7 = (derfab->super_BaseFab<double>).domain.bigend.vect[0];
  iVar8 = (derfab->super_BaseFab<double>).domain.bigend.vect[1];
  pAVar19 = &PeleLM::spec_Bilger_fact;
  pdVar17 = local_88;
  for (lVar16 = 9; lVar16 != 0; lVar16 = lVar16 + -1) {
    *pdVar17 = pAVar19->_M_elems[0];
    pAVar19 = (Array<Real,_9> *)((long)pAVar19 + ((ulong)bVar35 * -2 + 1) * 8);
    pdVar17 = pdVar17 + (ulong)bVar35 * -2 + 1;
  }
  dVar36 = PeleLM::Zfu - PeleLM::Zox;
  iVar9 = (bx->smallend).vect[2];
  iVar10 = (bx->bigend).vect[2];
  if (iVar9 <= iVar10) {
    iVar29 = iVar29 + 1;
    iVar27 = iVar27 + 1;
    lVar16 = (long)(iVar29 - iVar2);
    lVar23 = (long)((iVar5 - iVar3) + 1);
    lVar24 = lVar23 * lVar16;
    lVar31 = (iVar7 - lVar33) + 1;
    iVar2 = (bx->bigend).vect[0];
    iVar5 = (bx->bigend).vect[1];
    iVar7 = (bx->smallend).vect[1];
    iVar11 = (bx->smallend).vect[0];
    do {
      if (iVar7 <= iVar5) {
        pdVar17 = (double *)
                  ((long)pdVar12 +
                  (((long)iVar27 * 8 + (long)iVar4 * -0x10 + (long)iVar9 * 8) * lVar23 +
                  (long)iVar7 * 8 + (long)iVar3 * -8) * lVar16 + (long)iVar11 * 8 + lVar26 * -8);
        lVar20 = ((long)iVar9 - (long)iVar6) * ((iVar8 - lVar15) + 1) * lVar31;
        lVar28 = (long)iVar7;
        do {
          if (iVar11 <= iVar2) {
            lVar21 = (lVar28 - lVar15) * lVar31;
            pdVar22 = pdVar17;
            lVar32 = (long)iVar11;
            do {
              dVar1 = pdVar12[(iVar9 - iVar4) * lVar24 +
                              (lVar28 - iVar3) * lVar16 + (lVar32 - lVar26)];
              lVar18 = lVar32 - lVar33;
              pdVar13[lVar20 + lVar21 + lVar18] = 0.0;
              dVar37 = 0.0;
              lVar25 = 0;
              pdVar30 = pdVar22;
              do {
                dVar37 = dVar37 + *pdVar30 * local_88[lVar25] * (1.0 / dVar1);
                pdVar13[lVar20 + lVar21 + lVar18] = dVar37;
                lVar25 = lVar25 + 1;
                pdVar30 = pdVar30 + (iVar27 - iVar4) * lVar24;
              } while (lVar25 != 9);
              pdVar13[lVar20 + lVar21 + lVar18] = (dVar37 - RVar14) * (1.0 / dVar36);
              lVar32 = lVar32 + 1;
              pdVar22 = pdVar22 + 1;
            } while (iVar2 + 1 != (int)lVar32);
          }
          lVar28 = lVar28 + 1;
          pdVar17 = pdVar17 + (iVar29 - lVar26);
        } while (iVar5 + 1 != (int)lVar28);
      }
      bVar34 = iVar9 != iVar10;
      iVar9 = iVar9 + 1;
    } while (bVar34);
  }
  return;
}

Assistant:

void pelelm_dermixfrac (const Box& bx, FArrayBox& derfab, int dcomp, int ncomp,
                  const FArrayBox& datfab, const Geometry& /*geomdata*/,
                  Real /*time*/, const int* /*bcrec*/, int /*level*/)

{
    AMREX_ASSERT(derfab.box().contains(bx));
    AMREX_ASSERT(datfab.box().contains(bx));
    AMREX_ASSERT(derfab.nComp() >= dcomp + ncomp);
    AMREX_ASSERT(datfab.nComp() >= NUM_SPECIES+1);
    AMREX_ASSERT(ncomp == 1);

    if (!PeleLM::mixture_fraction_ready) amrex::Abort("Mixture fraction not initialized");

    auto const density   = datfab.array(0);
    auto const rhoY      = datfab.array(1);
    auto       mixt_frac = derfab.array(0);

    // TODO probably better way to do this ?
    amrex::Real Zox_lcl   = PeleLM::Zox;
    amrex::Real Zfu_lcl   = PeleLM::Zfu;
    amrex::Real denom_inv = 1.0 / (Zfu_lcl - Zox_lcl);
    amrex::GpuArray<amrex::Real,NUM_SPECIES> fact_lcl;
    for (int n=0; n<NUM_SPECIES; ++n) {
        fact_lcl[n] = PeleLM::spec_Bilger_fact[n];
    }

    amrex::ParallelFor(bx,
    [density, rhoY, mixt_frac, fact_lcl, Zox_lcl, denom_inv] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        calcMixtFrac(i,j,k,
                     Zox_lcl, denom_inv, fact_lcl.data(),
                     density, rhoY, mixt_frac);
    });
}